

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
DefaultState<false>::String
          (DefaultState<false> *this,Context<false> *ctx,char *str,SizeType length,bool copy)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  for (uVar3 = 0; length != uVar3; uVar3 = uVar3 + 1) {
    bVar1 = str[uVar3];
    if ((((ulong)bVar1 < 0x3b) && ((0x400000100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       (bVar1 == 0x7c)) {
      str[uVar3] = '_';
    }
  }
  uVar2 = ctx->key_length;
  memmove(str + -(ulong)uVar2,ctx->key,(ulong)uVar2);
  Namespace<false>::AddFeature
            ((ctx->namespace_path).
             super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
             super__Vector_impl_data._M_finish + -1,ctx->all,str + -(ulong)uVar2);
  return &this->super_BaseState<false>;
}

Assistant:

BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool copy)
  {
    assert(!copy);

    // string escape
    const char* end = str + length;
    for (char* p = (char*)str; p != end; p++)
    {
      switch (*p)
      {
        case ' ':
        case '\t':
        case '|':
        case ':':
          *p = '_';
      }
    }

    char* prepend = (char*)str - ctx.key_length;
    memmove(prepend, ctx.key, ctx.key_length);

    ctx.CurrentNamespace().AddFeature(ctx.all, prepend);

    return this;
  }